

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

void __thiscall
slang::SourceManager::addDiagnosticDirective
          (SourceManager *this,SourceLocation location,string_view name,DiagnosticSeverity severity)

{
  vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
  *this_00;
  size_t sVar1;
  bool bVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  __normal_iterator<slang::SourceManager::DiagnosticDirectiveInfo_*,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
  local_88;
  const_iterator local_80;
  BufferID local_74;
  vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
  *local_70;
  vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
  *vec;
  size_t local_58;
  size_t offset;
  unique_lock<std::shared_mutex> lock;
  SourceLocation local_38;
  SourceLocation fileLocation;
  DiagnosticSeverity severity_local;
  SourceManager *this_local;
  string_view name_local;
  SourceLocation location_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (SourceManager *)name._M_len;
  lock._8_8_ = location;
  fileLocation._4_4_ = severity;
  name_local._M_str = (char *)location;
  local_38 = getFullyExpandedLoc(this,location);
  std::unique_lock<std::shared_mutex>::unique_lock
            ((unique_lock<std::shared_mutex> *)&offset,&this->mut);
  local_58 = SourceLocation::offset(&local_38);
  local_74 = SourceLocation::buffer(&local_38);
  local_70 = (vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
              *)ska::
                flat_hash_map<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::Hasher<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>
                ::operator[](&this->diagDirectives,&local_74);
  bVar2 = std::
          vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
          ::empty((vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
                   *)local_70);
  sVar1 = local_58;
  if (!bVar2) {
    pvVar3 = std::
             vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
             ::back((vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
                     *)local_70);
    this_00 = local_70;
    if (sVar1 < pvVar3->offset) {
      iVar4 = std::
              vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
              ::begin((vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
                       *)local_70);
      iVar5 = std::
              vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
              ::end((vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
                     *)local_70);
      local_88 = std::
                 upper_bound<__gnu_cxx::__normal_iterator<slang::SourceManager::DiagnosticDirectiveInfo*,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,unsigned_long,slang::SourceManager::addDiagnosticDirective(slang::SourceLocation,std::basic_string_view<char,std::char_traits<char>>,slang::DiagnosticSeverity)::__0>
                           (iVar4._M_current,iVar5._M_current,&local_58);
      __gnu_cxx::
      __normal_iterator<slang::SourceManager::DiagnosticDirectiveInfo_const*,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>
      ::__normal_iterator<slang::SourceManager::DiagnosticDirectiveInfo*>
                ((__normal_iterator<slang::SourceManager::DiagnosticDirectiveInfo_const*,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>
                  *)&local_80,&local_88);
      std::
      vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
      ::
      emplace<std::basic_string_view<char,std::char_traits<char>>&,unsigned_long&,slang::DiagnosticSeverity&>
                (this_00,local_80,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                 &local_58,(DiagnosticSeverity *)&fileLocation.field_0x4);
      goto LAB_0027bb77;
    }
  }
  std::
  vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
  ::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&,unsigned_long&,slang::DiagnosticSeverity&>
            (local_70,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_58,
             (DiagnosticSeverity *)&fileLocation.field_0x4);
LAB_0027bb77:
  std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)&offset);
  return;
}

Assistant:

void SourceManager::addDiagnosticDirective(SourceLocation location, string_view name,
                                           DiagnosticSeverity severity) {
    SourceLocation fileLocation = getFullyExpandedLoc(location);

    std::unique_lock lock(mut);

    size_t offset = fileLocation.offset();
    auto& vec = diagDirectives[fileLocation.buffer()];
    if (vec.empty() || offset >= vec.back().offset)
        vec.emplace_back(name, offset, severity);
    else {
        // Keep the list in sorted order. Typically new additions should be at the end,
        // in which case we'll hit the condition above, but just in case we will do the
        // full search and insert here.
        vec.emplace(std::upper_bound(vec.begin(), vec.end(), offset,
                                     [](size_t offset, auto& diag) {
                                         return offset < diag.offset;
                                     }),
                    name, offset, severity);
    }
}